

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O1

void * __thiscall
adios2::format::BP5Deserializer::GetMetadataBase
          (BP5Deserializer *this,BP5VarRec *VarRec,size_t Step,size_t WriterRank)

{
  pointer pvVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  unsigned_long uVar5;
  ulong uVar6;
  vector<void_*,_std::allocator<void_*>_> **ppvVar7;
  
  if (this->m_RandomAccessMode == true) {
    pvVar1 = (this->m_ControlArray).
             super__Vector_base<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = ((long)(this->m_ControlArray).
                   super__Vector_base<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
            -0x5555555555555555;
    if ((Step <= uVar6 && uVar6 - Step != 0) &&
       (lVar2 = *(long *)&pvVar1[Step].
                          super__Vector_base<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>
                          ._M_impl.super__Vector_impl_data,
       WriterRank <
       (ulong)((long)*(pointer *)
                      ((long)&pvVar1[Step].
                              super__Vector_base<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>
                              ._M_impl.super__Vector_impl_data + 8) - lVar2 >> 3))) {
      lVar2 = *(long *)(lVar2 + WriterRank * 8);
      lVar3 = **(long **)(lVar2 + 0x18);
      uVar6 = VarRec->VarNum;
      if ((uVar6 < (ulong)((*(long **)(lVar2 + 0x18))[1] - lVar3 >> 3)) &&
         ((*(long *)(lVar3 + uVar6 * 8) != 0 &&
          (iVar4 = BP5Base::BP5BitfieldTest
                             ((BP5Base *)
                              ((long)&this->_vptr_BP5Deserializer +
                              (long)this->_vptr_BP5Deserializer[-3]),
                              *(BP5MetadataInfoStruct **)
                               (*(long *)&((this->MetadataBaseArray).
                                           super__Vector_base<std::vector<void_*,_std::allocator<void_*>_>_*,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start[Step]->
                                          super__Vector_base<void_*,_std::allocator<void_*>_>).
                                          _M_impl.super__Vector_impl_data + WriterRank * 8),
                              *(int *)(**(long **)(lVar2 + 0x20) + uVar6 * 8)), iVar4 != 0)))) {
        uVar5 = *(unsigned_long *)(**(long **)(lVar2 + 0x18) + VarRec->VarNum * 8);
        ppvVar7 = (this->MetadataBaseArray).
                  super__Vector_base<std::vector<void_*,_std::allocator<void_*>_>_*,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start + Step;
        goto LAB_0061f090;
      }
    }
  }
  else {
    uVar5 = (VarRec->PerWriterMetaFieldOffset).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[WriterRank];
    if (uVar5 != 0) {
      ppvVar7 = &this->m_MetadataBaseAddrs;
LAB_0061f090:
      return (void *)(uVar5 + (long)((*ppvVar7)->super__Vector_base<void_*,_std::allocator<void_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start[WriterRank]);
    }
  }
  return (void *)0x0;
}

Assistant:

void *BP5Deserializer::GetMetadataBase(BP5VarRec *VarRec, size_t Step, size_t WriterRank) const
{
    MetaArrayRec *writer_meta_base = NULL;
    if (m_RandomAccessMode)
    {
        if (Step >= m_ControlArray.size() || WriterRank >= m_ControlArray[Step].size())
        {
            return NULL; // we don't have this rank in this step
        }
        ControlInfo *CI = m_ControlArray[Step][WriterRank]; // writer control array
        if (((*CI->MetaFieldOffset).size() <= VarRec->VarNum) ||
            ((*CI->MetaFieldOffset)[VarRec->VarNum] == 0))
        {
            // Var does not appear in this record
            return NULL;
        }
        size_t CI_VarIndex = (*CI->CIVarIndex)[VarRec->VarNum];
        BP5MetadataInfoStruct *BaseData =
            (BP5MetadataInfoStruct *)(*MetadataBaseArray[Step])[WriterRank];
        if (!BP5BitfieldTest(BaseData, (int)CI_VarIndex))
        {
            // Var appears in CI, but wasn't written on this step
            return NULL;
        }
        size_t MetadataFieldOffset = (*CI->MetaFieldOffset)[VarRec->VarNum];
        writer_meta_base = (MetaArrayRec *)(((char *)(*MetadataBaseArray[Step])[WriterRank]) +
                                            MetadataFieldOffset);
    }
    else
    {
        if (VarRec->PerWriterMetaFieldOffset[WriterRank] == 0)
        {
            // Writer didn't write this var
            return NULL;
        }
        writer_meta_base = (MetaArrayRec *)(((char *)(*m_MetadataBaseAddrs)[WriterRank]) +
                                            VarRec->PerWriterMetaFieldOffset[WriterRank]);
    }
    return writer_meta_base;
}